

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

Matrix_t SE3_Ry(float degree)

{
  double dVar1;
  double dVar2;
  Matrix_t MVar3;
  
  MVar3.pMatrix = (float *)malloc(0x40);
  if (MVar3.pMatrix == (float *)0x0) {
    printf("ERROR: Malloc failed!-08");
  }
  MVar3.pMatrix[0xc] = 0.0;
  MVar3.pMatrix[0xd] = 0.0;
  MVar3.pMatrix[0xe] = 0.0;
  MVar3.pMatrix[0xf] = 0.0;
  MVar3.pMatrix[8] = 0.0;
  MVar3.pMatrix[9] = 0.0;
  MVar3.pMatrix[10] = 0.0;
  MVar3.pMatrix[0xb] = 0.0;
  MVar3.pMatrix[4] = 0.0;
  MVar3.pMatrix[5] = 0.0;
  MVar3.pMatrix[6] = 0.0;
  MVar3.pMatrix[7] = 0.0;
  MVar3.pMatrix[0] = 0.0;
  MVar3.pMatrix[1] = 0.0;
  MVar3.pMatrix[2] = 0.0;
  MVar3.pMatrix[3] = 0.0;
  dVar1 = (double)((degree / 180.0) * 3.1415927);
  dVar2 = cos(dVar1);
  *MVar3.pMatrix = (float)dVar2;
  dVar2 = sin(dVar1);
  MVar3.pMatrix[2] = (float)dVar2;
  MVar3.pMatrix[5] = 1.0;
  dVar2 = sin(dVar1);
  MVar3.pMatrix[8] = -(float)dVar2;
  dVar1 = cos(dVar1);
  MVar3.pMatrix[10] = (float)dVar1;
  MVar3.pMatrix[0xf] = 1.0;
  MVar3.row = '\x04';
  MVar3.column = '\x04';
  MVar3._10_6_ = 0;
  return MVar3;
}

Assistant:

Matrix_t SE3_Ry(float degree)
{
	float rad = (float)(degree / 180.0 * PI);
	int i, j;
	Matrix_t temp;
	float *se_y = (float *)malloc(sizeof(float) * 4 * 4);
	if (se_y == NULL)
		printf("ERROR: Malloc failed!-08");
	for (i = 0; i < 4; i++)
		for (j = 0; j < 4; j++)
			*(se_y + i * 4 + j) = 0;
	*(se_y + 0 * 4 + 0) = (float)cos(rad);
	*(se_y + 0 * 4 + 2) = (float)sin(rad);
	*(se_y + 1 * 4 + 1) = 1;
	*(se_y + 2 * 4 + 0) = -(float)sin(rad);
	*(se_y + 2 * 4 + 2) = (float)cos(rad);
	*(se_y + 3 * 4 + 3) = 1;

	temp.pMatrix = se_y;
	temp.row = 4;
	temp.column = 4;

	return temp;
}